

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O2

void __thiscall FFlatVertexBuffer::~FFlatVertexBuffer(FFlatVertexBuffer *this)

{
  GLuint GVar1;
  
  (this->super_FVertexBuffer)._vptr_FVertexBuffer = (_func_int **)&PTR__FFlatVertexBuffer_007c3348;
  GVar1 = (this->super_FVertexBuffer).vbo_id;
  if (GVar1 != 0) {
    (*_ptrc_glBindBuffer)(0x8892,GVar1);
    (*_ptrc_glUnmapBuffer)(0x8892);
    (*_ptrc_glBindBuffer)(0x8892,0);
  }
  if ((gl.legacyMode == true) && (this->map != (FFlatVertex *)0x0)) {
    operator_delete__(this->map);
  }
  this->map = (FFlatVertex *)0x0;
  TArray<FFlatVertex,_FFlatVertex>::~TArray(&this->vbo_shadowdata);
  FVertexBuffer::~FVertexBuffer(&this->super_FVertexBuffer);
  return;
}

Assistant:

FFlatVertexBuffer::~FFlatVertexBuffer()
{
	if (vbo_id != 0)
	{
		glBindBuffer(GL_ARRAY_BUFFER, vbo_id);
		glUnmapBuffer(GL_ARRAY_BUFFER);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
	}
	if (gl.legacyMode)
	{
		delete[] map;
	}
	map = nullptr;
}